

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLedgerEntry.cpp
# Opt level: O0

void __thiscall jbcoin::STLedgerEntry::STLedgerEntry(STLedgerEntry *this,Keylet *k)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  KnownFormats<jbcoin::LedgerEntryType> *this_00;
  Item *type;
  Item *format;
  Keylet *k_local;
  STLedgerEntry *this_local;
  
  STObject::STObject(&this->super_STObject,(SField *)sfLedgerEntry);
  CountedObject<jbcoin::STLedgerEntry>::CountedObject((CountedObject<jbcoin::STLedgerEntry> *)this);
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STLedgerEntry_00519ff8;
  uVar1 = *(undefined8 *)(k->key).pn;
  uVar2 = *(undefined8 *)((k->key).pn + 2);
  uVar3 = *(undefined8 *)((k->key).pn + 6);
  *(undefined8 *)((this->key_).pn + 4) = *(undefined8 *)((k->key).pn + 4);
  *(undefined8 *)((this->key_).pn + 6) = uVar3;
  *(undefined8 *)(this->key_).pn = uVar1;
  *(undefined8 *)((this->key_).pn + 2) = uVar2;
  this->type_ = k->type;
  this_00 = &LedgerFormats::getInstance()->super_KnownFormats<jbcoin::LedgerEntryType>;
  type = KnownFormats<jbcoin::LedgerEntryType>::findByType(this_00,this->type_);
  if (type == (Item *)0x0) {
    Throw<std::runtime_error,char_const(&)[26]>((char (*) [26])"invalid ledger entry type");
  }
  STObject::set(&this->super_STObject,&type->elements);
  STObject::setFieldU16(&this->super_STObject,(SField *)sfLedgerEntryType,(short)this->type_);
  return;
}

Assistant:

STLedgerEntry::STLedgerEntry (Keylet const& k)
    :  STObject(sfLedgerEntry)
    , key_ (k.key)
    , type_ (k.type)
{
    auto const format =
        LedgerFormats::getInstance().findByType (type_);

    if (format == nullptr)
        Throw<std::runtime_error> ("invalid ledger entry type");

    set (format->elements);

    setFieldU16 (sfLedgerEntryType,
        static_cast <std::uint16_t> (type_));
}